

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  Vector<float,_2> *this;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *this_00;
  SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *s;
  MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  *m;
  Jacobian<Measurement,_Measurement> *m_00;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  State *pSVar5;
  ostream *poVar6;
  ulong uVar7;
  float fVar8;
  float fVar9;
  result_type rVar10;
  float fVar11;
  undefined1 local_2d0 [8];
  UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> ukf;
  SystemModel sys;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> predictor;
  ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>_> ekf;
  OrientationModel om;
  PositionModel pm;
  normal_distribution<float> noise;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_60;
  float local_58;
  float local_54;
  float local_50;
  Control<float> local_4c;
  Control u;
  OrientationMeasurement orientation;
  float local_38;
  float local_34;
  
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  ._vptr_SystemModel = (_func_int **)0x3f800000;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 1.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .
  super_SystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  ._44_4_ = 0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  ._48_4_ = 0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  ._52_8_ = 0x3f800000;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  ._60_8_ = 0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  ._68_8_ = 0x3f8000003f800000;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  ._76_4_ = 0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
  ukf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._28_8_ =
       &PTR_f_0010eb70;
  KalmanExamples::Robot1::PositionMeasurementModel<float,_Kalman::StandardBase>::
  PositionMeasurementModel
            ((PositionMeasurementModel<float,_Kalman::StandardBase> *)
             &om.
              super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
              .V,-10.0,-10.0,30.0,75.0);
  om.
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  .
  super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  ._vptr_MeasurementModel = (_func_int **)0x3f8000003f800000;
  om.
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  .
  super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  .super_StandardBase<KalmanExamples::Robot1::OrientationMeasurement<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_1,_1,_0,_1,_1>_>.m_storage.m_data.array[0] =
       (Covariance<KalmanExamples::Robot1::OrientationMeasurement<float>_>)0x0;
  om.
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  .
  super_MeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  ._12_4_ = 0;
  om.
  super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
  ._16_4_ = 0x3f800000;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array._28_8_ =
       &PTR_h_0010ed00;
  local_60._M_x = 0x1b207;
  pm.landmark2.super_Matrix<float,_2,_1>.super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>
  .m_storage.m_data.array =
       (Matrix<float,_2,_1>)
       (PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>)0x3f80000000000000;
  predictor.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 1.0;
  predictor.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
  ekf.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 1.0;
  ekf.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] = 1.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] = 0.0;
  ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] = 1.0;
  Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_>::UnscentedKalmanFilter
            ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>_> *)local_2d0,1.0,2.0,0.0);
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  sys.
  super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
  ._116_4_ = 0;
  predictor.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 0.0;
  predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.0;
  ekf.super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_2d0._0_4_ = 0.0;
  local_2d0._4_4_ = 0.0;
  ukf.super_UnscentedKalmanFilterBase<KalmanExamples::Robot1::State<float>_>.
  super_KalmanFilterBase<KalmanExamples::Robot1::State<float>_>.x.super_Vector<float,_3>.
  super_Matrix<float,_3,_1>.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  uVar7 = 1;
  local_38 = 0.0;
  local_34 = 0.0;
  fVar11 = 0.0;
  do {
    local_4c.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         1.0627905;
    local_4c.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         (float)(&DAT_0010b0a0)[0x32 < uVar7];
    fVar11 = fVar11 + local_4c.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                      array[1];
    fVar8 = cosf(fVar11);
    fVar8 = fVar8 * local_4c.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                    array[0];
    fVar9 = sinf(fVar11);
    fVar9 = fVar9 * local_4c.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
                    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.
                    array[0];
    this = &pm.landmark2;
    rVar10 = std::normal_distribution<float>::operator()
                       ((normal_distribution<float> *)this,&local_60,(param_type *)this);
    local_38 = rVar10 * 0.1 + fVar8 + local_38;
    rVar10 = std::normal_distribution<float>::operator()
                       ((normal_distribution<float> *)this,&local_60,(param_type *)this);
    local_34 = rVar10 * 0.1 + fVar9 + local_34;
    rVar10 = std::normal_distribution<float>::operator()
                       ((normal_distribution<float> *)this,&local_60,(param_type *)this);
    fVar11 = rVar10 * 0.1 + fVar11;
    pSVar5 = Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
                       ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
                        ((long)sys.
                               super_LinearizedSystemModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                               .W.super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                               m_storage.m_data.array + 0x20),
                        (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase>
                         *)((long)&ukf.
                                   super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                                   super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                                   super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                   m_storage.m_data + 0x1c),&local_4c);
    local_50 = (pSVar5->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
    ;
    local_54 = (pSVar5->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
    ;
    local_58 = (pSVar5->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
               super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
    ;
    this_00 = (ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
              ((long)&predictor.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                      super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                      super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
              0x1c);
    s = (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *)
        ((long)&ukf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data + 0x1c)
    ;
    Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
    predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>(this_00,s,&local_4c);
    Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
    predict<KalmanExamples::Robot1::Control<float>,Kalman::StandardBase>
              ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)local_2d0,
               (SystemModelType<KalmanExamples::Robot1::Control<float>,_Kalman::StandardBase> *)s,
               &local_4c);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] = fVar11;
    rVar10 = std::normal_distribution<float>::operator()
                       ((normal_distribution<float> *)this,&local_60,(param_type *)this);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         rVar10 * 0.025 +
         u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0];
    m = (MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
         *)((long)&ekf.super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                   super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                   super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data +
           0x1c);
    Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
    update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
              (this_00,m,(OrientationMeasurement<float> *)&u);
    Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
    update<KalmanExamples::Robot1::OrientationMeasurement<float>,Kalman::StandardBase>
              ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)local_2d0,
               (MeasurementModelType<KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
                *)m,(OrientationMeasurement<float> *)&u);
    fVar8 = (local_34 -
            pm.
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            .V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[3]
            ) * (local_34 -
                pm.
                super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                .V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
                array[3]) +
            (local_38 -
            pm.
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
            .V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.array[2]
            ) * (local_38 -
                pm.
                super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                .V.super_PlainObjectBase<Eigen::Matrix<float,_2,_2,_0,_2,_2>_>.m_storage.m_data.
                array[2]);
    if (fVar8 < 0.0) {
      u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
           sqrtf(fVar8);
    }
    else {
      u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
           SQRT(fVar8);
    }
    fVar8 = (local_34 -
            pm.landmark1.super_Matrix<float,_2,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]) *
            (local_34 -
            pm.landmark1.super_Matrix<float,_2,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1]) +
            (local_38 -
            pm.landmark1.super_Matrix<float,_2,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]) *
            (local_38 -
            pm.landmark1.super_Matrix<float,_2,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0]);
    if (fVar8 < 0.0) {
      u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
           sqrtf(fVar8);
    }
    else {
      u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
      super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
           SQRT(fVar8);
    }
    rVar10 = std::normal_distribution<float>::operator()
                       ((normal_distribution<float> *)this,&local_60,(param_type *)this);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0] =
         rVar10 * 0.25 +
         u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[0];
    rVar10 = std::normal_distribution<float>::operator()
                       ((normal_distribution<float> *)this,&local_60,(param_type *)this);
    u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
    super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1] =
         rVar10 * 0.25 +
         u.super_Vector<float,_2>.super_Matrix<float,_2,_1>.
         super_PlainObjectBase<Eigen::Matrix<float,_2,_1,_0,_2,_1>_>.m_storage.m_data.array[1];
    m_00 = &om.
            super_LinearizedMeasurementModel<KalmanExamples::Robot1::State<float>,_KalmanExamples::Robot1::OrientationMeasurement<float>,_Kalman::StandardBase>
            .V;
    pSVar5 = Kalman::ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
                       ((ExtendedKalmanFilter<KalmanExamples::Robot1::State<float>> *)
                        ((long)&predictor.
                                super_StandardFilterBase<KalmanExamples::Robot1::State<float>_>.
                                super_StandardBase<KalmanExamples::Robot1::State<float>_>.P.
                                super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.
                                m_storage.m_data + 0x1c),
                        (MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                         *)m_00,(PositionMeasurement<float> *)&u);
    fVar8 = (pSVar5->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    fVar9 = (pSVar5->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    fVar1 = (pSVar5->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    pSVar5 = Kalman::UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>>::
             update<KalmanExamples::Robot1::PositionMeasurement<float>,Kalman::StandardBase>
                       ((UnscentedKalmanFilter<KalmanExamples::Robot1::State<float>> *)local_2d0,
                        (MeasurementModelType<KalmanExamples::Robot1::PositionMeasurement<float>,_Kalman::StandardBase>
                         *)m_00,(PositionMeasurement<float> *)&u);
    fVar2 = (pSVar5->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
    fVar3 = (pSVar5->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
    fVar4 = (pSVar5->super_Vector<float,_3>).super_Matrix<float,_3,_1>.
            super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
    poVar6 = std::ostream::_M_insert<double>((double)local_38);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)local_34);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)fVar11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)local_54);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)local_58);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)fVar8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)fVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)fVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)fVar2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)fVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,",",1);
    poVar6 = std::ostream::_M_insert<double>((double)fVar4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    uVar7 = uVar7 + 1;
  } while (uVar7 != 0x65);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    // Simulated (true) system state
    State x;
    x.setZero();
    
    // Control input
    Control u;
    // System
    SystemModel sys;
    
    // Measurement models
    // Set position landmarks at (-10, -10) and (30, 75)
    PositionModel pm(-10, -10, 30, 75);
    OrientationModel om;
    
    // Random number generation (for noise simulation)
    std::default_random_engine generator;
    generator.seed( 111111 );
    std::normal_distribution<T> noise(0, 1);
    
    // Some filters for estimation
    // Pure predictor without measurement updates
    Kalman::ExtendedKalmanFilter<State> predictor;
    // Extended Kalman Filter
    Kalman::ExtendedKalmanFilter<State> ekf;
    // Unscented Kalman Filter
    Kalman::UnscentedKalmanFilter<State> ukf(1);
    
    // Init filters with true system state
    predictor.init(x);
    ekf.init(x);
    ukf.init(x);
    
    // Standard-Deviation of noise added to all state vector components during state transition
    T systemNoise = 0.1;
    // Standard-Deviation of noise added to all measurement vector components in orientation measurements
    T orientationNoise = 0.025;
    // Standard-Deviation of noise added to all measurement vector components in distance measurements
    T distanceNoise = 0.25;
    
    // Simulate for 100 steps
    const size_t N = 100;
    for(size_t i = 1; i <= N; i++)
    {
        // Generate some control input
        u.v() = 1. + std::sin( T(2) * T(M_PI) / T(N) );
        u.dtheta() = std::sin( T(2) * T(M_PI) / T(N) ) * (1 - 2*(i > 50));
        
        // Simulate system
        x = sys.f(x, u);
        
        // Add noise: Our robot move is affected by noise (due to actuator failures)
        x.x() += systemNoise*noise(generator);
        x.y() += systemNoise*noise(generator);
        x.theta() += systemNoise*noise(generator);
        
        // Predict state for current time-step using the filters
        auto x_pred = predictor.predict(sys, u);
        auto x_ekf = ekf.predict(sys, u);
        auto x_ukf = ukf.predict(sys, u);
        
        // Orientation measurement
        {
            // We can measure the orientation every 5th step
            OrientationMeasurement orientation = om.h(x);
            
            // Measurement is affected by noise as well
            orientation.theta() += orientationNoise * noise(generator);
            
            // Update EKF
            x_ekf = ekf.update(om, orientation);
            
            // Update UKF
            x_ukf = ukf.update(om, orientation);
        }
        
        // Position measurement
        {
            // We can measure the position every 10th step
            PositionMeasurement position = pm.h(x);
            
            // Measurement is affected by noise as well
            position.d1() += distanceNoise * noise(generator);
            position.d2() += distanceNoise * noise(generator);
            
            // Update EKF
            x_ekf = ekf.update(pm, position);
            
            // Update UKF
            x_ukf = ukf.update(pm, position);
        }
        
        // Print to stdout as csv format
        std::cout   << x.x() << "," << x.y() << "," << x.theta() << ","
                    << x_pred.x() << "," << x_pred.y() << "," << x_pred.theta()  << ","
                    << x_ekf.x() << "," << x_ekf.y() << "," << x_ekf.theta()  << ","
                    << x_ukf.x() << "," << x_ukf.y() << "," << x_ukf.theta()
                    << std::endl;
    }
    
    return 0;
}